

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

int trans_cmp_fn(ScanStateTransition *a,ScanStateTransition *b,hash_fns_t *fns)

{
  uint local_2c;
  uint i;
  hash_fns_t *fns_local;
  ScanStateTransition *b_local;
  ScanStateTransition *a_local;
  
  if ((fns->data[0] == (void *)0x0) && ((a->live_diff).n != (b->live_diff).n)) {
    a_local._4_4_ = 1;
  }
  else if ((a->accepts_diff).n == (b->accepts_diff).n) {
    if (fns->data[0] == (void *)0x0) {
      for (local_2c = 0; local_2c < (a->live_diff).n; local_2c = local_2c + 1) {
        if ((a->live_diff).v[local_2c] != (b->live_diff).v[local_2c]) {
          return 1;
        }
      }
    }
    for (local_2c = 0; local_2c < (a->accepts_diff).n; local_2c = local_2c + 1) {
      if ((a->accepts_diff).v[local_2c] != (b->accepts_diff).v[local_2c]) {
        return 1;
      }
    }
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int trans_cmp_fn(ScanStateTransition *a, ScanStateTransition *b, hash_fns_t *fns) {
  uint i;

  if (!fns->data[0])
    if (a->live_diff.n != b->live_diff.n) return 1;
  if (a->accepts_diff.n != b->accepts_diff.n) return 1;
  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++)
      if (a->live_diff.v[i] != b->live_diff.v[i]) return 1;
  for (i = 0; i < a->accepts_diff.n; i++)
    if (a->accepts_diff.v[i] != b->accepts_diff.v[i]) return 1;
  return 0;
}